

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall WriterTest_WriteInt_Test::TestBody(WriterTest_WriteInt_Test *this)

{
  __type_conflict1 _Var1;
  AssertionResult *pAVar2;
  int *in_RDX;
  int *value;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *buf_00;
  uint *value_00;
  int *value_01;
  int *value_02;
  uint *value_03;
  char *pcVar3;
  AssertHelper local_a20 [4];
  char *local_a00;
  AssertionResult gtest_ar_2;
  AssertionResult local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  undefined3 uStack_997;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_990 [46];
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> writer;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0 [62];
  
  os = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x2a;
  uStack_997 = 0;
  (anonymous_namespace)::AnyWriteChecker::operator()(&gtest_ar,(char *)&os,in_RDX);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&os);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x269,pcVar3);
    testing::internal::AssertHelper::operator=(local_a20,(Message *)&os);
    testing::internal::AssertHelper::~AssertHelper(local_a20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&os);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  os = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xd6;
  uStack_997 = 0xffffff;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((basic_buffer<char> *)&gtest_ar,(char *)&os,value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&os);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26a,pcVar3);
    testing::internal::AssertHelper::operator=(local_a20,(Message *)&os);
    testing::internal::AssertHelper::~AssertHelper(local_a20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&os);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a00 = "char";
  gtest_ar._0_8_ = &PTR_grow_00264c28;
  writer.locale_.locale_ = (void *)0x0;
  writer.out_.container = (basic_buffer<char> *)&gtest_ar;
  gtest_ar.message_.ptr_ = local_7f0;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_decimal<int>(&writer,0xc);
  fmt::v5::to_string<char,500ul>(&actual,(v5 *)&gtest_ar,buf);
  expected._M_string_length = 0;
  expected.field_2._M_allocated_capacity._0_4_ =
       expected.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  expected._M_dataplus._M_p = (pointer)&expected.field_2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::ostream::operator<<(&os,0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&expected,(string *)local_a20);
  std::__cxx11::string::~string((string *)local_a20);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  _Var1 = std::operator==(&expected,&actual);
  if (_Var1) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<
                       ((AssertionResult *)&os,(char (*) [19])"Value of: (Writer<");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_a00);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [21])">() << value).str()\n");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e09);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&actual);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e15);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&expected);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
    testing::AssertionResult::AssertionResult(&local_9e8,pAVar2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(local_990);
  }
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&actual);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&gtest_ar);
  if (local_9e8.success_ == true) {
    local_a00 = "wchar_t";
    gtest_ar._0_8_ = &PTR_grow_00264d50;
    writer.locale_.locale_ = (void *)0x0;
    writer.out_.container = (basic_buffer<char> *)&gtest_ar;
    gtest_ar.message_.ptr_ = local_7f0;
    fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
    write_decimal<int>((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                        *)&writer,0xc);
    fmt::v5::to_string<wchar_t,500ul>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&actual
               ,(v5 *)&gtest_ar,buf_00);
    expected._M_string_length = 0;
    expected.field_2._M_allocated_capacity._0_4_ = 0;
    expected._M_dataplus._M_p = (pointer)&expected.field_2;
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&os);
    std::wostream::operator<<((wostream *)&os,0xc);
    std::__cxx11::wstringbuf::str();
    std::__cxx11::wstring::operator=((wstring *)&expected,(wstring *)local_a20);
    std::__cxx11::wstring::~wstring((wstring *)local_a20);
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)&os);
    _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)&expected,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)&actual);
    if (_Var1) {
      testing::AssertionSuccess();
    }
    else {
      testing::AssertionFailure();
      pAVar2 = testing::AssertionResult::operator<<
                         ((AssertionResult *)&os,(char (*) [19])"Value of: (Writer<");
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_a00);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [21])">() << value).str()\n");
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e09);
      pAVar2 = testing::AssertionResult::operator<<
                         (pAVar2,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                  *)&actual);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e15);
      pAVar2 = testing::AssertionResult::operator<<
                         (pAVar2,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                  *)&expected);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
      testing::AssertionResult::AssertionResult(&gtest_ar_2,pAVar2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(local_990);
    }
    std::__cxx11::wstring::~wstring((wstring *)&expected);
    std::__cxx11::wstring::~wstring((wstring *)&actual);
    fmt::v5::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
              ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)&gtest_ar);
  }
  else {
    testing::AssertionResult::AssertionResult(&gtest_ar_2,&local_9e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_9e8.message_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&os,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&os,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&os);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  os = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x22;
  uStack_997 = 0;
  (anonymous_namespace)::AnyWriteChecker::operator()(&gtest_ar,(char *)&os,value_00);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&os);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26c,pcVar3);
    testing::internal::AssertHelper::operator=(local_a20,(Message *)&os);
    testing::internal::AssertHelper::~AssertHelper(local_a20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&os);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  os = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x0;
  uStack_997 = 0x800000;
  (anonymous_namespace)::AnyWriteChecker::operator()(&gtest_ar,(char *)&os,value_01);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&os);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26d,pcVar3);
    testing::internal::AssertHelper::operator=(local_a20,(Message *)&os);
    testing::internal::AssertHelper::~AssertHelper(local_a20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&os);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  os = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xff;
  uStack_997 = 0x7fffff;
  (anonymous_namespace)::AnyWriteChecker::operator()(&gtest_ar,(char *)&os,value_02);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&os);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26e,pcVar3);
    testing::internal::AssertHelper::operator=(local_a20,(Message *)&os);
    testing::internal::AssertHelper::~AssertHelper(local_a20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&os);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  os = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xff;
  uStack_997 = 0xffffff;
  (anonymous_namespace)::AnyWriteChecker::operator()(&gtest_ar,(char *)&os,value_03);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&os);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x26f,pcVar3);
    testing::internal::AssertHelper::operator=(local_a20,(Message *)&os);
    testing::internal::AssertHelper::~AssertHelper(local_a20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&os);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(WriterTest, WriteInt) {
  CHECK_WRITE(42);
  CHECK_WRITE(-42);
  CHECK_WRITE(static_cast<short>(12));
  CHECK_WRITE(34u);
  CHECK_WRITE(std::numeric_limits<int>::min());
  CHECK_WRITE(std::numeric_limits<int>::max());
  CHECK_WRITE(std::numeric_limits<unsigned>::max());
}